

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializationWrapper.cpp
# Opt level: O3

void fs_get_serializer_metainfo_f(void *serializer,char *name,int name_length,float *value)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,name,name + name_length);
  ser::MetainfoSet::ExtractValue<float>((MetainfoSet *)((long)serializer + 0x10),&local_40,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void fs_get_serializer_metainfo_f(void* serializer, const char* name, int name_length, float* value)
{
    Serializer& sp = *reinterpret_cast<Serializer*>(serializer);
    sp.globalMetainfo().ExtractValue(std::string(name, name_length), *value);
}